

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::Search(ON_RTree *this,ON_Polyline *polyline,
                _func_bool_void_ptr_ON__INT_PTR *resultCallback,ON_RTreePolylineContext *a_context)

{
  ON_RTreeNode *a_node;
  uint uVar1;
  int plcount;
  undefined1 local_58 [8];
  ON_Workspace ws;
  ON_RTreeSearchPolylineResultCallback result;
  ON_RTreePolylineContext *a_context_local;
  _func_bool_void_ptr_ON__INT_PTR *resultCallback_local;
  ON_Polyline *polyline_local;
  ON_RTree *this_local;
  
  if (((this->m_root == (ON_RTreeNode *)0x0) || (polyline == (ON_Polyline *)0x0)) ||
     (resultCallback == (_func_bool_void_ptr_ON__INT_PTR *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = ON_SimpleArray<ON_3dPoint>::UnsignedCount((ON_SimpleArray<ON_3dPoint> *)polyline);
    if (uVar1 < 2) {
      this_local._7_1_ = true;
    }
    else {
      ws.m_pMemBlk = (ON_Workspace_MBLK *)a_context;
      ON_Workspace::ON_Workspace((ON_Workspace *)local_58);
      a_node = this->m_root;
      plcount = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)polyline);
      this_local._7_1_ =
           SearchPolylinePart(a_node,polyline,0,plcount,
                              (ON_RTreeSearchPolylineResultCallback *)&ws.m_pMemBlk);
      ON_Workspace::~ON_Workspace((ON_Workspace *)local_58);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::Search(
  const ON_Polyline* polyline,
  bool ON_CALLBACK_CDECL resultCallback(void* a_context, ON__INT_PTR a_id),
  ON_RTreePolylineContext* a_context
) const
{
  if (0 == m_root || 0 == polyline || nullptr == resultCallback) return false;
  if (polyline->UnsignedCount() < 2) return true;

  ON_RTreeSearchPolylineResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = resultCallback;
  ON_Workspace ws;
  result.m_ws = &ws;
  return SearchPolylinePart(m_root, polyline, 0, polyline->Count(), result);
}